

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-run-once.c
# Opt level: O2

int run_test_run_once(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  uVar2 = uv_default_loop();
  uv_idle_init(uVar2,&idle_handle);
  uv_idle_start(&idle_handle,idle_cb);
  do {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
  } while (iVar1 != 0);
  eval_a = (int64_t)idle_counter;
  eval_b = 0x40;
  if (eval_a == 0x40) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    eval_a = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    eval_b = (int64_t)iVar1;
    if (eval_b == 0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar4 = "uv_loop_close(uv_default_loop())";
    pcVar3 = "0";
    uVar2 = 0x2e;
  }
  else {
    pcVar4 = "64";
    pcVar3 = "idle_counter";
    uVar2 = 0x2c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-run-once.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(run_once) {
  uv_idle_init(uv_default_loop(), &idle_handle);
  uv_idle_start(&idle_handle, idle_cb);

  while (uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT_EQ(idle_counter, NUM_TICKS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}